

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O3

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint _h;
  uint _d;
  int *piVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  size_t sVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong local_a0;
  ulong local_50;
  
  iVar1 = bottom_blob->elempack;
  uVar16 = (ulong)iVar1;
  iVar10 = this->out_elempack;
  uVar17 = (ulong)iVar10;
  if (iVar1 == iVar10) goto LAB_00440049;
  iVar2 = bottom_blob->w;
  lVar8 = (long)iVar2;
  _h = bottom_blob->h;
  uVar9 = (ulong)_h;
  _d = bottom_blob->d;
  iVar13 = bottom_blob->c;
  iVar12 = bottom_blob->dims;
  uVar4 = bottom_blob->elemsize;
  if (this->use_padding == 0) {
    if (iVar12 == 2) {
      if ((int)(_h * iVar1) % iVar10 != 0) goto LAB_00440049;
      goto LAB_0044057c;
    }
    if (iVar12 != 1) {
      if ((iVar12 - 3U < 2) && ((iVar13 * iVar1) % iVar10 != 0)) goto LAB_00440049;
      goto code_r0x004400ef;
    }
    if ((iVar2 * iVar1) % iVar10 != 0) {
LAB_00440049:
      if (top_blob != bottom_blob) {
        piVar3 = bottom_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar3 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar3;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar1 = bottom_blob->w;
        iVar10 = bottom_blob->h;
        iVar2 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar1;
        top_blob->h = iVar10;
        top_blob->d = iVar2;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      return 0;
    }
switchD_004400fd_caseD_1:
    if (iVar10 == 1) {
      if (top_blob == bottom_blob) {
        iVar10 = 1;
      }
      else {
        piVar3 = bottom_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar3 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar3;
        top_blob->allocator = bottom_blob->allocator;
        top_blob->dims = bottom_blob->dims;
        iVar10 = bottom_blob->d;
        top_blob->h = bottom_blob->h;
        top_blob->d = iVar10;
        top_blob->c = bottom_blob->c;
        iVar10 = this->out_elempack;
      }
      top_blob->w = iVar1 * iVar2;
      top_blob->cstep = lVar8 * uVar16;
      top_blob->elemsize = uVar4 / uVar16;
      top_blob->elempack = iVar10;
      return 0;
    }
    Mat::create(top_blob,(iVar1 * iVar2 + iVar10 + -1) / iVar10,uVar17 * (uVar4 / uVar16),iVar10,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    memcpy(top_blob->data,bottom_blob->data,uVar4 * lVar8);
  }
  else {
code_r0x004400ef:
    switch(iVar12) {
    case 1:
      goto switchD_004400fd_caseD_1;
    case 2:
LAB_0044057c:
      uVar9 = (long)(int)(iVar10 + _h * iVar1 + -1) / (long)iVar10;
      sVar11 = (uVar4 / uVar16) * uVar17;
      uVar17 = sVar11 / uVar17;
      iVar13 = (int)uVar9;
      Mat::create(top_blob,iVar2,iVar13,sVar11,iVar10,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (0 < iVar13) {
        uVar16 = 0;
        do {
          if (0 < iVar2) {
            pvVar7 = top_blob->data;
            uVar15 = (ulong)(uint)this->out_elempack;
            lVar18 = 0;
            do {
              if (0 < (int)uVar15) {
                lVar20 = 0;
                do {
                  iVar13 = (int)uVar16 * (int)uVar15 + (int)lVar20;
                  iVar10 = iVar13 / iVar1;
                  if ((int)_h <= iVar10) break;
                  memcpy((void *)((long)pvVar7 +
                                 uVar17 * lVar20 + sVar11 * lVar18 + sVar11 * lVar8 * uVar16),
                         (void *)((long)bottom_blob->data +
                                 (long)(iVar13 % iVar1) * uVar17 + uVar4 * lVar18 +
                                 (long)iVar10 * lVar8 * uVar4),uVar17);
                  lVar20 = lVar20 + 1;
                  uVar15 = (ulong)this->out_elempack;
                } while (lVar20 < (long)uVar15);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != lVar8);
          }
          uVar16 = uVar16 + 1;
          if (uVar16 == (uVar9 & 0xffffffff)) {
            return 0;
          }
        } while( true );
      }
      break;
    case 3:
      uVar15 = (long)(iVar1 * iVar13 + iVar10 + -1) / (long)iVar10;
      sVar11 = (uVar4 / uVar16) * uVar17;
      uVar17 = sVar11 / uVar17;
      iVar12 = (int)uVar15;
      Mat::create(top_blob,iVar2,_h,iVar12,sVar11,iVar10,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (0 < iVar12) {
        uVar16 = 0;
        do {
          if (0 < (int)_h) {
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            pvVar7 = top_blob->data;
            local_a0 = 0;
            do {
              if (0 < iVar2) {
                uVar14 = (ulong)(uint)this->out_elempack;
                lVar18 = 0;
                do {
                  if (0 < (int)uVar14) {
                    lVar20 = 0;
                    do {
                      iVar12 = (int)uVar16 * (int)uVar14 + (int)lVar20;
                      iVar10 = iVar12 / iVar1;
                      if (iVar13 <= iVar10) break;
                      memcpy((void *)((long)pvVar7 +
                                     uVar17 * lVar20 +
                                     sVar11 * lVar18 +
                                     local_a0 * lVar8 * sVar11 + sVar5 * uVar16 * sVar6),
                             (void *)((long)bottom_blob->data +
                                     (long)(iVar12 % iVar1) * uVar17 +
                                     uVar4 * lVar18 + local_a0 * lVar8 * uVar4 +
                                     (long)iVar10 * bottom_blob->cstep * bottom_blob->elemsize),
                             uVar17);
                      lVar20 = lVar20 + 1;
                      uVar14 = (ulong)this->out_elempack;
                    } while (lVar20 < (long)uVar14);
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 != lVar8);
              }
              local_a0 = local_a0 + 1;
            } while (local_a0 != uVar9);
          }
          uVar16 = uVar16 + 1;
          if (uVar16 == (uVar15 & 0xffffffff)) {
            return 0;
          }
        } while( true );
      }
      break;
    case 4:
      uVar15 = (long)(iVar13 * iVar1 + iVar10 + -1) / (long)iVar10;
      sVar11 = (uVar4 / uVar16) * uVar17;
      uVar17 = sVar11 / uVar17;
      iVar12 = (int)uVar15;
      Mat::create(top_blob,iVar2,_h,_d,iVar12,sVar11,iVar10,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (0 < iVar12) {
        uVar16 = 0;
        do {
          if (0 < (int)_d) {
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            pvVar7 = top_blob->data;
            local_50 = 0;
            do {
              if (0 < (int)_h) {
                local_a0 = 0;
                do {
                  if (0 < iVar2) {
                    lVar18 = (local_50 * uVar9 + local_a0) * lVar8;
                    uVar14 = (ulong)(uint)this->out_elempack;
                    lVar20 = 0;
                    do {
                      if (0 < (int)uVar14) {
                        lVar19 = 0;
                        do {
                          iVar12 = (int)uVar16 * (int)uVar14 + (int)lVar19;
                          iVar10 = iVar12 / iVar1;
                          if (iVar13 <= iVar10) break;
                          memcpy((void *)((long)pvVar7 +
                                         uVar17 * lVar19 +
                                         sVar11 * lVar20 + lVar18 * sVar11 + sVar5 * uVar16 * sVar6)
                                 ,(void *)((long)bottom_blob->data +
                                          (long)(iVar12 % iVar1) * uVar17 +
                                          uVar4 * lVar20 + lVar18 * uVar4 +
                                          (long)iVar10 * bottom_blob->cstep * bottom_blob->elemsize)
                                 ,uVar17);
                          lVar19 = lVar19 + 1;
                          uVar14 = (ulong)this->out_elempack;
                        } while (lVar19 < (long)uVar14);
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != lVar8);
                  }
                  local_a0 = local_a0 + 1;
                } while (local_a0 != uVar9);
              }
              local_50 = local_50 + 1;
            } while (local_50 != _d);
          }
          uVar16 = uVar16 + 1;
          if (uVar16 == (uVar15 & 0xffffffff)) {
            return 0;
          }
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = (size_t)w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + (size_t)i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + (size_t)srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + (size_t)i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + (size_t)i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int z = 0; z < d; z++)
            {
                for (int i = 0; i < h; i++)
                {
                    unsigned char* outptr = (unsigned char*)out + (size_t)(z * h + i) * w * out_elemsize;

                    for (int j = 0; j < w; j++)
                    {
                        unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                        for (int k = 0; k < out_elempack; k++)
                        {
                            int srcq = (q * out_elempack + k) / elempack;
                            if (srcq >= channels)
                                break;

                            int srck = (q * out_elempack + k) % elempack;

                            const Mat m = bottom_blob.channel(srcq);
                            const unsigned char* ptr = (const unsigned char*)m + (size_t)(z * h + i) * w * elemsize;
                            const unsigned char* elem_ptr = ptr + j * elemsize;

                            memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                        }
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}